

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldAppearance.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::MinefieldAppearance::MinefieldAppearance
          (MinefieldAppearance *this,MinefieldType T,KBOOL IsStatusActive,KBOOL IsLaneActive,
          KBOOL IsStateActive)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__MinefieldAppearance_00225d80;
  (this->m_ui16BitUnion).m_ui16App =
       (ushort)!IsStateActive << 0xd |
       ((ushort)T & 3) + (ushort)!IsStatusActive * 4 + (ushort)!IsLaneActive * 8;
  return;
}

Assistant:

MinefieldAppearance::MinefieldAppearance( MinefieldType T, KBOOL IsStatusActive, KBOOL IsLaneActive, KBOOL IsStateActive )
{
    m_ui16BitUnion.m_ui16App = 0;
    m_ui16BitUnion.m_ui16Type = T;
    m_ui16BitUnion.m_ui16ActiveStatus = (IsStatusActive ? 0 : 1);
    m_ui16BitUnion.m_ui16Lane = (IsLaneActive ? 0 : 1);
    m_ui16BitUnion.m_ui16State = (IsStateActive ? 0 : 1);
}